

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauTree.c
# Opt level: O2

int Dss_ObjCheckTransparent(Dss_Man_t *p,Dss_Obj_t *pObj)

{
  int iVar1;
  Dss_Obj_t *pDVar2;
  uint i;
  
  do {
    iVar1 = 0;
    switch(*(uint *)&pObj->field_0x4 & 7) {
    case 4:
      i = 0;
      do {
        if (*(uint *)&pObj->field_0x4 >> 0x1b <= i) {
          return 0;
        }
        pDVar2 = Dss_ObjFanin(p->vObjs,pObj,i);
        if (pDVar2 == (Dss_Obj_t *)0x0) {
          return 0;
        }
        iVar1 = Dss_ObjCheckTransparent(p,pDVar2);
        i = i + 1;
      } while (iVar1 == 0);
    case 2:
      iVar1 = 1;
    case 3:
    case 6:
      return iVar1;
    case 5:
      pDVar2 = Dss_ObjFanin(p->vObjs,pObj,1);
      iVar1 = Dss_ObjCheckTransparent(p,pDVar2);
      if (iVar1 == 0) {
        return 0;
      }
      pObj = Dss_ObjFanin(p->vObjs,pObj,2);
      break;
    default:
      __assert_fail("pObj->Type == DAU_DSD_PRIME",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauTree.c"
                    ,0x709,"int Dss_ObjCheckTransparent(Dss_Man_t *, Dss_Obj_t *)");
    }
  } while( true );
}

Assistant:

int Dss_ObjCheckTransparent( Dss_Man_t * p, Dss_Obj_t * pObj )
{
    Dss_Obj_t * pFanin;
    int i;
    if ( pObj->Type == DAU_DSD_VAR )
        return 1;
    if ( pObj->Type == DAU_DSD_AND )
        return 0;
    if ( pObj->Type == DAU_DSD_XOR )
    {
        Dss_ObjForEachFanin( p->vObjs, pObj, pFanin, i )
            if ( Dss_ObjCheckTransparent( p, pFanin ) )
                return 1;
        return 0;
    }
    if ( pObj->Type == DAU_DSD_MUX )
    {
        pFanin = Dss_ObjFanin( p->vObjs, pObj, 1 );
        if ( !Dss_ObjCheckTransparent(p, pFanin) )
            return 0;
        pFanin = Dss_ObjFanin( p->vObjs, pObj, 2 );
        if ( !Dss_ObjCheckTransparent(p, pFanin) )
            return 0;
        return 1;
    }
    assert( pObj->Type == DAU_DSD_PRIME );
    return 0;
}